

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPlusTree.h
# Opt level: O1

void __thiscall
BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
::erase_node(BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
             *this)

{
  Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
  *this_00;
  BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
  **ppBVar1;
  size_t index;
  undefined1 local_68 [16];
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  Keyword local_38;
  
  this->next = (BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
                *)0x0;
  this->data_size = 0;
  this->subset_size = 0;
  index = 0;
  do {
    if (index != 3) {
      local_68[0] = 0;
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char*>((string *)local_58,local_68,local_68);
      local_38 = ZERO;
      this_00 = b_array::
                Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
                ::operator[](&this->data,index);
      std::__cxx11::string::operator=((string *)this_00,(string *)local_58);
      this_00->value = local_38;
      if (local_58[0] != local_48) {
        operator_delete(local_58[0]);
      }
    }
    ppBVar1 = b_array::
              Array<BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>_*>
              ::operator[](&this->subset,index);
    *ppBVar1 = (BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
                *)0x0;
    index = index + 1;
  } while (index != 4);
  return;
}

Assistant:

void BPlusTree<T>::erase_node() {
    data_size = 0;
    next = nullptr;
    subset_size = 0;
    // null out the subset array before it causes problems
    for (size_t i = 0; i < SUBSET_CAPACITY; ++i) {
        if (i < DATA_CAPACITY)
            data[i] = T();
        subset[i] = nullptr;
    }
}